

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::jumpGreaterThanOrEqualUnsigned(CodeGen *codeGen,int target)

{
  size_t i;
  long lVar1;
  IntToBytes converter;
  uchar local_16;
  uchar local_15;
  value_type_conflict2 local_14 [4];
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,&local_15);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,&local_16);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(codeGen,local_14 + lVar1);
  }
  return;
}

Assistant:

void Amd64Backend::jumpGreaterThanOrEqualUnsigned(CodeGen& codeGen, int target) {
		IntToBytes converter;
		converter.intValue = target;

		codeGen.push_back(0x0F);
		codeGen.push_back(0x83);

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}